

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_textedit_cut(nk_text_edit *state)

{
  uint uVar1;
  bool bVar2;
  
  uVar1 = 0;
  if (state->mode != '\0') {
    bVar2 = state->select_start != state->select_end;
    if (bVar2) {
      nk_textedit_delete_selection(state);
      state->has_preferred_x = '\0';
    }
    uVar1 = (uint)bVar2;
  }
  return uVar1;
}

Assistant:

NK_API int
nk_textedit_cut(struct nk_text_edit *state)
{
    /* API cut: delete selection */
    if (state->mode == NK_TEXT_EDIT_MODE_VIEW)
        return 0;
    if (NK_TEXT_HAS_SELECTION(state)) {
        nk_textedit_delete_selection(state); /* implicitly clamps */
        state->has_preferred_x = 0;
        return 1;
    }
   return 0;
}